

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O2

QDomNodePrivate * __thiscall
QDomNodePrivate::removeChild(QDomNodePrivate *this,QDomNodePrivate *oldChild)

{
  QDomNodePrivate *pQVar1;
  QDomDocumentPrivate *pQVar2;
  QDomNodePrivate *pQVar3;
  
  pQVar3 = (QDomNodePrivate *)0x0;
  if (((oldChild->field_0x98 & 2) != 0) && (oldChild->ownerNode == this)) {
    pQVar2 = ownerDocument(this);
    if (pQVar2 != (QDomDocumentPrivate *)0x0) {
      pQVar2->nodeListTime = pQVar2->nodeListTime + 1;
    }
    pQVar3 = oldChild->prev;
    pQVar1 = oldChild->next;
    if (pQVar1 == (QDomNodePrivate *)0x0) {
      if ((pQVar3 == (QDomNodePrivate *)0x0) && (this->first != oldChild)) {
        return (QDomNodePrivate *)0x0;
      }
    }
    else {
      pQVar1->prev = pQVar3;
    }
    if (pQVar3 != (QDomNodePrivate *)0x0) {
      pQVar3->next = pQVar1;
    }
    if (this->last == oldChild) {
      this->last = pQVar3;
    }
    if (this->first == oldChild) {
      this->first = oldChild->next;
    }
    setNoParent(oldChild);
    oldChild->prev = (QDomNodePrivate *)0x0;
    oldChild->next = (QDomNodePrivate *)0x0;
    LOCK();
    (oldChild->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (oldChild->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    pQVar3 = oldChild;
  }
  return pQVar3;
}

Assistant:

QDomNodePrivate* QDomNodePrivate::removeChild(QDomNodePrivate* oldChild)
{
    // Error check
    if (oldChild->parent() != this)
        return nullptr;

    // "mark lists as dirty"
    QDomDocumentPrivate *const doc = ownerDocument();
    if (doc)
        doc->nodeListTime++;

    // Perhaps oldChild was just created with "createElement" or that. In this case
    // its parent is QDomDocument but it is not part of the documents child list.
    if (oldChild->next == nullptr && oldChild->prev == nullptr && first != oldChild)
        return nullptr;

    if (oldChild->next)
        oldChild->next->prev = oldChild->prev;
    if (oldChild->prev)
        oldChild->prev->next = oldChild->next;

    if (last == oldChild)
        last = oldChild->prev;
    if (first == oldChild)
        first = oldChild->next;

    oldChild->setNoParent();
    oldChild->next = nullptr;
    oldChild->prev = nullptr;

    // We are no longer interested in the old node
    oldChild->ref.deref();

    return oldChild;
}